

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallmon.cpp
# Opt level: O2

void __thiscall
wallmon::update_stats(wallmon *this,vector<int,_std::allocator<int>_> *pids,string read_path)

{
  pid_t *ppVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  pair<int,_unsigned_long_long> pVar4;
  allocator local_245;
  float uptime_sec;
  string local_240;
  ifstream proc_uptime;
  byte abStack_200 [488];
  
  if ((this->got_mother_starttime == false) &&
     (ppVar1 = (pids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start,
     (pids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
     != ppVar1)) {
    pVar4 = get_mother_starttime(this,*ppVar1);
    if (pVar4.first != 0) {
      std::__cxx11::string::string
                ((string *)&proc_uptime,"Error while reading mother starttime",
                 (allocator *)&local_240);
      MessageBase::warning(&this->super_MessageBase,(string *)&proc_uptime);
      std::__cxx11::string::~string((string *)&proc_uptime);
      return;
    }
    this->got_mother_starttime = true;
    std::__cxx11::string::string((string *)&proc_uptime,"wtime",(allocator *)&local_240);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
             ::at(&this->walltime_stats,(key_type *)&proc_uptime);
    uVar3 = sysconf(2);
    prmon::monitored_value::set_offset(pmVar2,pVar4.second / uVar3);
    std::__cxx11::string::~string((string *)&proc_uptime);
  }
  std::ifstream::ifstream(&proc_uptime,"/proc/uptime",_S_in);
  uptime_sec = 0.0;
  std::istream::_M_extract<float>((float *)&proc_uptime);
  if ((abStack_200[*(long *)(_proc_uptime + -0x18)] & 5) == 0) {
    std::__cxx11::string::string((string *)&local_240,"wtime",&local_245);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
             ::at(&this->walltime_stats,&local_240);
    prmon::monitored_value::set_value
              (pmVar2,(long)(uptime_sec - 9.223372e+18) & (long)uptime_sec >> 0x3f |
                      (long)uptime_sec);
  }
  else {
    std::__cxx11::string::string((string *)&local_240,"Error while reading /proc/uptime",&local_245)
    ;
    MessageBase::warning(&this->super_MessageBase,&local_240);
  }
  std::__cxx11::string::~string((string *)&local_240);
  std::ifstream::~ifstream(&proc_uptime);
  return;
}

Assistant:

void wallmon::update_stats(const std::vector<pid_t>& pids,
                           const std::string read_path) {
  if (!got_mother_starttime && pids.size() > 0) {
    auto code_and_time = get_mother_starttime(pids[0]);
    if (code_and_time.first) {
      warning("Error while reading mother starttime");
      return;
    } else {
      got_mother_starttime = true;
      walltime_stats.at("wtime").set_offset(code_and_time.second /
                                            sysconf(_SC_CLK_TCK));
    }
  }

  std::ifstream proc_uptime{"/proc/uptime"};
  float uptime_sec{};
  proc_uptime >> uptime_sec;
  if (!proc_uptime) {
    warning("Error while reading /proc/uptime");
    return;
  }

  walltime_stats.at("wtime").set_value(uptime_sec);
}